

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O3

void work_mgga_fxc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,xc_mgga_out_params *out)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  double dVar111;
  double dVar112;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  undefined1 auVar137 [16];
  double dVar113;
  double dVar114;
  double dVar115;
  undefined1 auVar138 [16];
  double dVar116;
  double dVar117;
  double dVar118;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar192;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  double dVar273;
  double dVar274;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar302;
  undefined1 auVar284 [16];
  double dVar303;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  double dVar275;
  undefined1 auVar288 [16];
  double dVar276;
  undefined1 auVar289 [16];
  double dVar304;
  undefined1 auVar290 [16];
  double dVar305;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  double dVar323;
  undefined1 auVar314 [16];
  double dVar324;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  double dVar330;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  double dVar333;
  double dVar334;
  double dVar335;
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  double dVar350;
  double dVar351;
  double dVar352;
  undefined1 auVar353 [16];
  double dVar362;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  double dVar367;
  double dVar368;
  double dVar369;
  double dVar370;
  double dVar371;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  double dVar381;
  double dVar382;
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  double dVar383;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  double dVar384;
  double dVar385;
  double dVar386;
  double dVar387;
  undefined1 auVar388 [16];
  double dVar389;
  double dVar390;
  double dVar391;
  double dVar392;
  double dVar393;
  double dVar394;
  double dVar395;
  undefined1 auVar396 [16];
  double dVar399;
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  double local_f78;
  double local_ed8;
  double local_da8;
  double dStack_da0;
  double local_d68;
  double dStack_d60;
  double local_d58;
  double local_cc8;
  double local_c80;
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  undefined1 local_b98 [320];
  double local_a58;
  double local_a08;
  double dStack_a00;
  double local_9e8;
  double dStack_9e0;
  double local_878;
  double local_788;
  double dStack_780;
  double local_768;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  double local_6f8;
  double dStack_6f0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_638;
  double dStack_630;
  double local_628;
  double dStack_620;
  double local_4e8;
  double local_4c8;
  double dStack_4c0;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_3e8;
  double dStack_3e0;
  double local_348;
  double local_1c8;
  double dStack_1c0;
  double dVar380;
  
  if (np != 0) {
    sVar7 = 0;
    local_c80 = 0.0;
    do {
      lVar6 = (long)(p->dim).rho * sVar7;
      dVar12 = rho[lVar6];
      if (p->nspin == 2) {
        dVar12 = dVar12 + rho[lVar6 + 1];
      }
      dVar1 = p->dens_threshold;
      if (dVar1 <= dVar12) {
        dVar12 = rho[lVar6];
        if (rho[lVar6] <= dVar1) {
          dVar12 = dVar1;
        }
        dVar13 = p->sigma_threshold * p->sigma_threshold;
        local_ed8 = sigma[(long)(p->dim).sigma * sVar7];
        if (sigma[(long)(p->dim).sigma * sVar7] <= dVar13) {
          local_ed8 = dVar13;
        }
        uVar2 = p->info->flags;
        if ((uVar2 >> 0x10 & 1) != 0) {
          local_c80 = tau[(long)(p->dim).tau * sVar7];
          if (tau[(long)(p->dim).tau * sVar7] <= p->tau_threshold) {
            local_c80 = p->tau_threshold;
          }
          if (((uVar2 >> 0x11 & 1) != 0) && (dVar13 = dVar12 * 8.0 * local_c80, dVar13 <= local_ed8)
             ) {
            local_ed8 = dVar13;
          }
        }
        dVar13 = p->zeta_threshold;
        dVar16 = (double)(-(ulong)(dVar13 < 1.0) & 0x3ff0000000000000 |
                         ~-(ulong)(dVar13 < 1.0) & (ulong)(dVar13 + -1.0 + 1.0));
        uVar8 = -(ulong)(dVar16 <= dVar13);
        dVar13 = (double)(uVar8 & (ulong)dVar13 | ~uVar8 & (ulong)dVar16);
        dVar14 = cbrt(dVar13);
        dVar15 = cbrt(dVar12);
        dVar16 = cbrt(9.0);
        dVar17 = cbrt(0.3183098861837907);
        dVar17 = dVar17 * dVar17 * dVar16 * dVar16;
        dVar69 = p->cam_omega * dVar17;
        dVar18 = 1.0 / dVar15;
        dVar19 = cbrt(9.869604401089358);
        dVar20 = 1.0 / (dVar19 * dVar19);
        dVar172 = dVar20 * 1.8171205928321397;
        dVar111 = local_ed8 * 1.5874010519681996;
        dVar223 = dVar12 * dVar12;
        dVar21 = 1.0 / (dVar15 * dVar15);
        dVar22 = dVar21 / dVar223;
        dVar112 = dVar111 * dVar22;
        dVar156 = (1.0 / dVar19) / 9.869604401089358;
        dVar193 = dVar156 * 3.3019272488946267;
        dVar254 = local_ed8 * local_ed8 * 1.2599210498948732;
        dVar23 = dVar223 * dVar223;
        dVar157 = dVar18 / (dVar12 * dVar23);
        dVar194 = dVar193 * 0.00537989809245259 * dVar254 * dVar157 +
                  dVar172 * 0.1504548888888889 * dVar112 + 1.0;
        dVar16 = pow(dVar194,0.1);
        auVar137._8_8_ = dVar16;
        auVar137._0_8_ = dVar14;
        auVar137 = divpd(_DAT_00f56e20,auVar137);
        dVar113 = auVar137._0_8_;
        dVar54 = auVar137._8_8_;
        dVar114 = dVar113 * dVar54;
        dVar70 = (dVar69 * 1.4422495703074083 * dVar18 * dVar114) / 18.0;
        dVar16 = 1e-10;
        if (1e-10 <= dVar70) {
          dVar16 = dVar70;
        }
        dVar71 = 1.35;
        if (dVar16 <= 1.35) {
          dVar71 = dVar16;
        }
        dVar24 = 1.0 / dVar71;
        dVar25 = erf(dVar24 * 0.5);
        dVar72 = dVar71 * dVar71;
        dVar26 = 1.0 / dVar72;
        dVar27 = exp(dVar26 * -0.25);
        dVar177 = dVar16;
        if (dVar16 <= 1.35) {
          dVar177 = 1.35;
        }
        dVar325 = dVar177 * dVar177;
        dVar346 = dVar325 * dVar325;
        dVar255 = 1.0 / (dVar325 * dVar346);
        dVar73 = dVar346 * dVar346;
        auVar55._0_8_ = dVar73 * dVar73;
        auVar55._8_8_ = dVar73;
        auVar137 = divpd(_DAT_00f56e20,auVar55);
        dVar273 = auVar137._0_8_;
        dVar302 = auVar137._8_8_;
        auVar312._8_8_ = dVar346;
        auVar312._0_8_ = dVar325;
        auVar89._8_8_ = dVar302;
        auVar89._0_8_ = dVar302;
        auVar312 = divpd(auVar89,auVar312);
        dVar224 = dVar302 / (dVar325 * dVar346);
        dVar195 = dVar27 + -1.0;
        dVar115 = dVar72 * -2.0 * dVar195 + dVar27 + -1.5;
        dVar73 = dVar71 + dVar71;
        dVar74 = dVar25 * 1.7724538509055159 + dVar73 * dVar115;
        dVar25 = 1.0 / dVar346;
        if (dVar16 < 1.35) {
          local_d58 = dVar71 * -2.6666666666666665 * dVar74 + 1.0;
        }
        else {
          auVar209._0_8_ = 1.0 / dVar325;
          auVar209._8_8_ = dVar25;
          auVar209 = divpd(auVar209,_DAT_00f630b0);
          auVar138._8_8_ = dVar302;
          auVar138._0_8_ = dVar255;
          auVar55 = divpd(auVar138,_DAT_00f630c0);
          auVar89 = divpd(auVar312,_DAT_00f630d0);
          auVar267._8_8_ = dVar273;
          auVar267._0_8_ = dVar224;
          auVar138 = divpd(auVar267,_DAT_00f630e0);
          local_d58 = ((((((auVar209._0_8_ - auVar209._8_8_) + auVar55._0_8_) - auVar55._8_8_) +
                        auVar89._0_8_) - auVar89._8_8_) + auVar138._0_8_) - auVar138._8_8_;
        }
        dVar14 = dVar14 * dVar13;
        dVar28 = pow(dVar194,0.2);
        dVar13 = 0.27;
        if (dVar16 <= 0.27) {
          dVar13 = dVar16;
        }
        dVar75 = dVar13 * dVar13;
        dVar29 = exp((-1.0 / dVar75) * 0.25);
        dVar30 = erf((1.0 / dVar13) * 0.5);
        dVar208 = dVar16;
        if (dVar16 <= 0.27) {
          dVar208 = 0.27;
        }
        dVar256 = dVar208 * dVar208;
        dVar347 = dVar256 * dVar256;
        auVar289._0_8_ = dVar347 * dVar347;
        auVar289._8_8_ = dVar347 * dVar256;
        auVar373._0_8_ = dVar256 * auVar289._0_8_;
        auVar373._8_8_ = auVar289._0_8_ * dVar347;
        dVar76 = 1.0 / auVar373._0_8_;
        dVar158 = auVar289._0_8_ * auVar289._0_8_;
        auVar313._8_8_ = dVar158 * dVar158;
        auVar313._0_8_ = dVar158;
        auVar313 = divpd(_DAT_00f56e20,auVar313);
        local_b98._8_8_ = auVar313._0_8_;
        dVar323 = auVar313._8_8_;
        auVar93._8_8_ = local_b98._8_8_;
        auVar93._0_8_ = local_b98._8_8_;
        auVar55 = divpd(auVar93,auVar373);
        dVar274 = 1.0 / auVar289._8_8_;
        dVar384 = 1.0 / auVar373._8_8_;
        auVar94._0_8_ = dVar256 * dVar158;
        auVar94._8_8_ = auVar289._8_8_ * auVar289._0_8_;
        dVar116 = dVar323 / auVar373._0_8_;
        auVar90._8_8_ = auVar94._8_8_;
        auVar90._0_8_ = auVar373._8_8_;
        auVar142._8_8_ = dVar323;
        auVar142._0_8_ = dVar323;
        auVar138 = divpd(auVar142,auVar90);
        auVar92._8_8_ = dVar347;
        auVar92._0_8_ = dVar256;
        auVar284._8_8_ = dVar323;
        auVar284._0_8_ = dVar323;
        auVar209 = divpd(auVar284,auVar92);
        auVar372._8_8_ = local_b98._8_8_;
        auVar372._0_8_ = 0x3ff0000000000000;
        auVar373 = divpd(auVar372,auVar94);
        dVar380 = auVar373._8_8_;
        auVar286._8_8_ = 0x3ff0000000000000;
        auVar286._0_8_ = dVar323;
        auVar96._8_8_ = auVar94._8_8_;
        auVar96._0_8_ = auVar289._8_8_;
        auVar267 = divpd(auVar286,auVar96);
        dVar31 = dVar75 * dVar75 * 64.0;
        dVar117 = dVar75 * 20.0 - dVar31;
        dVar118 = 1.0 / auVar289._0_8_;
        dVar77 = (double)local_b98._8_8_ / dVar347;
        local_b98._0_8_ = local_b98._8_8_;
        auVar140._8_8_ = local_b98._8_8_;
        auVar140._0_8_ = local_b98._8_8_;
        auVar89 = divpd(auVar140,auVar289);
        dVar333 = dVar323 / auVar289._0_8_;
        dVar326 = dVar75 * -36.0 + dVar13 * 10.0 * 1.7724538509055159 * dVar30 + dVar117 * dVar29 +
                  dVar31 + -3.0;
        dVar363 = auVar373._0_8_;
        dVar31 = auVar209._0_8_;
        dVar303 = auVar209._8_8_;
        if (dVar16 < 0.27) {
          dVar196 = dVar75 * 24.0 * dVar326 + 1.0;
        }
        else {
          auVar90 = divpd(auVar89,_DAT_00fc56e0);
          auVar209 = divpd(auVar55,_DAT_00fc56f0);
          auVar91._8_8_ = dVar380;
          auVar91._0_8_ = dVar323;
          auVar92 = divpd(auVar91,_DAT_00fc54f0);
          auVar93 = divpd(auVar138,_DAT_00fc5500);
          auVar139._8_8_ = dVar274;
          auVar139._0_8_ = 0x3f55f15f15f15f16;
          auVar167._8_8_ = 0x40c6800000000000;
          auVar167._0_8_ = dVar347;
          auVar140 = divpd(auVar139,auVar167);
          auVar94 = divpd(auVar267,_DAT_00fc5530);
          auVar141._8_8_ = dVar76;
          auVar141._0_8_ = dVar31;
          auVar142 = divpd(auVar141,_DAT_00fc5510);
          auVar285._8_8_ = dVar384;
          auVar285._0_8_ = dVar303;
          auVar286 = divpd(auVar285,_DAT_00fc5520);
          auVar95._8_8_ = local_b98._8_8_;
          auVar95._0_8_ = dVar333;
          auVar96 = divpd(auVar95,_DAT_00fc5540);
          auVar56._8_8_ = dVar363;
          auVar56._0_8_ = dVar116;
          auVar373 = divpd(auVar56,_DAT_00fc5550);
          dVar196 = auVar373._8_8_ +
                    auVar96._8_8_ +
                    auVar286._8_8_ +
                    auVar142._8_8_ +
                    dVar118 * 3.804788961038961e-06 +
                    (((auVar93._0_8_ - auVar93._8_8_) + auVar140._0_8_) - auVar140._8_8_) +
                    auVar94._8_8_ + dVar77 / 927028425523200.0 +
                    auVar373._0_8_ +
                    auVar96._0_8_ +
                    auVar286._0_8_ +
                    auVar142._0_8_ +
                    ((auVar209._8_8_ + ((auVar90._0_8_ - auVar90._8_8_) - auVar209._0_8_)) -
                    auVar92._8_8_) + auVar92._0_8_ + auVar94._0_8_;
        }
        dVar159 = dVar12 * 0.5;
        dVar32 = 1.0 / dVar28;
        dVar33 = local_c80 * 1.5874010519681996;
        dVar78 = dVar112 * 0.04229627833333333 +
                 dVar33 * -0.14554132 * (dVar21 / dVar12) + dVar19 * dVar19 * 0.14417005510442776;
        dVar34 = dVar78 * dVar196;
        dVar79 = 1.0 / (dVar28 * dVar28);
        dVar28 = dVar172 * dVar79;
        dVar19 = 0.32;
        if (dVar16 <= 0.32) {
          dVar19 = dVar16;
        }
        dVar80 = dVar19 * dVar19;
        dVar389 = 1.0 / dVar80;
        dVar35 = exp(dVar389 * -0.25);
        dVar36 = 1.0 / dVar19;
        dVar37 = erf(dVar36 * 0.5);
        dVar263 = dVar16;
        if (dVar16 <= 0.32) {
          dVar263 = 0.32;
        }
        dVar306 = dVar263 * dVar263;
        dVar390 = dVar306 * dVar306;
        auVar179._0_8_ = dVar306 * dVar390;
        dVar192 = dVar390 * dVar390;
        dVar81 = 1.0 / auVar179._0_8_;
        auVar236._0_8_ = dVar306 * dVar192;
        dVar82 = 1.0 / auVar236._0_8_;
        auVar210._0_8_ = dVar192 * auVar179._0_8_;
        auVar210._8_8_ = dVar390 * dVar192;
        dVar257 = dVar192 * dVar192;
        auVar97._0_8_ = 1.0 / dVar257;
        auVar341._8_8_ = auVar97._0_8_;
        auVar341._0_8_ = auVar97._0_8_;
        auVar236._8_8_ = dVar192;
        auVar287._8_8_ = auVar179._0_8_;
        auVar287._0_8_ = dVar390;
        auVar179._8_8_ = dVar390;
        auVar353._8_8_ = auVar97._0_8_;
        auVar353._0_8_ = auVar97._0_8_;
        auVar92 = divpd(auVar353,auVar179);
        auVar168._8_8_ = auVar97._0_8_;
        auVar168._0_8_ = auVar97._0_8_;
        auVar209 = divpd(auVar168,auVar236);
        auVar373 = divpd(_DAT_00f56e20,auVar210);
        auVar90 = divpd(auVar341,auVar210);
        dVar364 = 1.0 / (dVar257 * dVar257);
        auVar388._8_8_ = dVar364;
        auVar388._0_8_ = dVar364;
        auVar93 = divpd(auVar388,auVar287);
        dVar275 = dVar19 * dVar80;
        dVar258 = dVar80 * dVar80;
        dVar173 = dVar19 * dVar258;
        dVar197 = dVar258 * dVar275;
        dVar334 = dVar19 * dVar258 * dVar258 * -122880.0 +
                  dVar197 * 3840.0 + dVar173 * -576.0 + dVar19 * -8.0 + dVar275 * 256.0;
        dVar174 = dVar80 * dVar258;
        dVar259 = dVar174 * 5120.0 + dVar258 * -1440.0 + dVar80 * 224.0 + -35.0;
        dVar119 = dVar80 * 60.0 + -2.0;
        dVar198 = dVar275 * 24.0;
        dVar257 = dVar334 * dVar35 + dVar119 * 3.5449077018110318 * dVar37 + dVar198 * dVar259;
        dVar260 = 1.0 / dVar192;
        dVar199 = auVar97._0_8_ / dVar306;
        dVar327 = dVar364 / dVar306;
        local_628 = auVar373._0_8_;
        dStack_620 = auVar373._8_8_;
        if (dVar16 < 0.32) {
          dVar200 = dVar19 * 1.1428571428571428 * dVar257 + 1.0;
        }
        else {
          auVar97._8_8_ = dVar199;
          auVar96 = divpd(auVar97,_DAT_00fc5560);
          auVar142 = divpd(auVar92,_DAT_00fc6310);
          auVar140 = divpd(auVar209,_DAT_00fc6320);
          auVar373 = divpd(auVar90,_DAT_00fc6330);
          auVar57._8_8_ = dVar327;
          auVar57._0_8_ = dVar364;
          auVar94 = divpd(auVar57,_DAT_00fc55a0);
          auVar286 = divpd(auVar93,_DAT_00fc55b0);
          dVar200 = (((((auVar373._8_8_ +
                        ((auVar140._8_8_ +
                         ((auVar142._8_8_ +
                          ((local_628 / -115811942400.0 +
                            dStack_620 / 2530344960.0 +
                            dVar82 / -61501440.0 +
                            dVar260 * 5.871587902837903e-07 +
                            dVar81 / -56448.0 + 0.0003826530612244898 / dVar390 + auVar96._0_8_) -
                          auVar96._8_8_)) - auVar142._0_8_)) - auVar140._0_8_)) - auVar373._0_8_) +
                      auVar94._0_8_) - auVar94._8_8_) + auVar286._0_8_) - auVar286._8_8_;
        }
        dVar225 = dVar20 * dVar200 * 1.8171205928321397;
        dVar112 = dVar112 * dVar79;
        dVar38 = dVar225 * 0.026329605555555555 * dVar112 +
                 local_d58 * dVar32 + dVar34 * 0.43209876543209874 * dVar28;
        dVar175 = dVar15 * dVar14 * -0.36927938319101117;
        uVar8 = -(ulong)(dVar159 <= dVar1);
        dVar39 = (double)(~uVar8 & (ulong)(dVar175 * dVar38 + dVar175 * dVar38));
        pdVar3 = out->zk;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar6 = (long)(p->dim).zk * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + dVar39;
        }
        dVar307 = dVar18 / dVar12;
        dVar17 = dVar17 * p->cam_omega * 1.4422495703074083;
        dVar120 = dVar54 / dVar194;
        dVar40 = dVar21 / (dVar12 * dVar223);
        dVar121 = dVar111 * dVar40;
        dVar201 = dVar18 / (dVar223 * dVar23);
        dVar41 = dVar172 * -0.40121303703703703 * dVar121 +
                 dVar193 * -0.028692789826413812 * dVar254 * dVar201;
        dVar276 = 0.0;
        if (1e-10 <= dVar70) {
          auVar288._0_8_ = dVar114 * dVar69 * -1.4422495703074083 * dVar307;
          auVar288._8_8_ = dVar113 * dVar41 * dVar17 * dVar18 * dVar120;
          auVar373 = divpd(auVar288,_DAT_00fc55e0);
          dVar276 = auVar373._0_8_ - auVar373._8_8_;
        }
        dVar176 = dVar177 * dVar325;
        uVar9 = -(ulong)(1.35 < dVar16);
        dVar42 = (double)(uVar9 & (ulong)dVar276);
        auVar374._8_8_ = 0x3ff0000000000000;
        auVar374._0_8_ = dVar302;
        auVar342._8_8_ = dVar346 * dVar176;
        auVar342._0_8_ = dVar177;
        auVar237._8_8_ = dVar176;
        auVar237._0_8_ = dVar177 * dVar346;
        dVar122 = 0.0;
        if (dVar16 <= 1.35) {
          dVar122 = dVar276;
        }
        dVar160 = 1.0 / dVar176;
        dVar43 = 1.0 / (dVar177 * dVar346);
        auVar373 = divpd(auVar374,auVar342);
        auVar180._8_8_ = dVar346 * dVar176;
        auVar180._0_8_ = dVar177;
        dVar365 = auVar373._0_8_;
        dVar381 = auVar373._8_8_;
        auVar5._8_8_ = dVar302;
        auVar5._0_8_ = dVar302;
        auVar373 = divpd(auVar5,auVar237);
        auVar137 = divpd(auVar137,auVar180);
        dVar226 = 1.0 / (dVar71 * dVar72);
        dVar346 = dVar195 * dVar71 * -4.0;
        dVar176 = (dVar346 * dVar122 + dVar226 * dVar122 * dVar27 * 0.5) - dVar122 * dVar24 * dVar27
        ;
        dVar177 = -dVar27 * dVar26;
        dVar227 = dVar73 * dVar176 + (dVar122 + dVar122) * dVar115 + dVar177 * dVar122;
        dVar382 = auVar373._8_8_;
        dVar362 = auVar137._8_8_;
        dVar366 = auVar373._0_8_;
        dVar348 = auVar137._0_8_;
        if (dVar16 < 1.35) {
          local_ba8 = dVar122 * -2.6666666666666665 * dVar74 +
                      dVar71 * -2.6666666666666665 * dVar227;
        }
        else {
          auVar211._0_8_ = -dVar160 * dVar42;
          auVar211._8_8_ = dVar43 * dVar42;
          auVar373 = divpd(auVar211,_DAT_00f630f0);
          auVar343._0_8_ = dVar365 * dVar42;
          auVar343._8_8_ = dVar381 * dVar42;
          auVar96 = divpd(auVar343,_DAT_00f63100);
          auVar268._0_8_ = dVar366 * dVar42;
          auVar268._8_8_ = dVar382 * dVar42;
          auVar94 = divpd(auVar268,_DAT_00f63110);
          auVar181._0_8_ = dVar42 * dVar348;
          auVar181._8_8_ = dVar42 * dVar362;
          auVar137 = divpd(auVar181,_DAT_00f63120);
          local_ba8 = ((((((auVar373._8_8_ + auVar373._0_8_) - auVar96._8_8_) + auVar96._0_8_) -
                        auVar94._8_8_) + auVar94._0_8_) - auVar137._8_8_) + auVar137._0_8_;
        }
        uVar10 = -(ulong)(0.27 < dVar16);
        dVar44 = (double)(uVar10 & (ulong)dVar276);
        auVar354._0_8_ = dVar256 * dVar208;
        auVar182._8_8_ = dVar208;
        auVar182._0_8_ = auVar354._0_8_;
        dVar256 = dVar347 * auVar354._0_8_;
        dVar347 = dVar347 * dVar208;
        auVar4._8_8_ = dVar323;
        auVar4._0_8_ = dVar323;
        auVar137 = divpd(auVar4,auVar182);
        auVar238._0_8_ = auVar354._0_8_ * auVar289._0_8_;
        auVar238._8_8_ = dVar208 * auVar289._0_8_;
        auVar375._0_8_ = auVar289._0_8_ * dVar256;
        auVar375._8_8_ = auVar289._0_8_ * dVar347;
        auVar373 = divpd(auVar4,auVar375);
        auVar269._8_8_ = auVar375._8_8_;
        auVar269._0_8_ = auVar238._0_8_;
        auVar286 = divpd(_DAT_00f56e20,auVar269);
        auVar270._8_8_ = dVar208 * dVar158;
        auVar270._0_8_ = auVar375._0_8_;
        auVar94 = divpd(_DAT_00f56e20,auVar270);
        auVar354._8_8_ = dVar347;
        auVar96 = divpd(local_b98._0_16_,auVar354);
        dVar308 = (1.0 / dVar347) * -0.005357142857142857;
        auVar140 = divpd(local_b98._0_16_,auVar238);
        auVar289 = divpd(local_b98._0_16_,auVar375);
        auVar271._8_8_ = auVar238._0_8_;
        auVar271._0_8_ = dVar256;
        auVar239._8_8_ = auVar238._8_8_;
        auVar239._0_8_ = dVar256;
        auVar142 = divpd(auVar4,auVar239);
        auVar313 = divpd(auVar313,auVar271);
        dVar208 = 0.0;
        if (dVar16 <= 0.27) {
          dVar208 = dVar276;
        }
        dVar256 = 1.0 / dVar256;
        dVar45 = 1.0 / auVar238._8_8_;
        dVar347 = dVar323 / dVar347;
        dVar349 = dVar13 * dVar326;
        dVar228 = 1.0 / (dVar13 * dVar75);
        dVar202 = dVar13 * dVar75 * 256.0;
        dVar261 = dVar13 * dVar208 * 40.0 - dVar202 * dVar208;
        dVar229 = dVar228 * dVar117;
        dVar391 = dVar29 * dVar208;
        dVar123 = (1.0 / dVar13) * dVar29 * -10.0;
        dVar262 = dVar123 * dVar208 +
                  dVar208 * 10.0 * 1.7724538509055159 * dVar30 +
                  dVar13 * dVar208 * -72.0 + dVar261 * dVar29 + dVar229 * dVar391 * 0.5 +
                  dVar202 * dVar208;
        local_748 = auVar140._0_8_;
        dStack_740 = auVar140._8_8_;
        local_758 = auVar313._0_8_;
        dStack_750 = auVar313._8_8_;
        dVar277 = auVar289._0_8_;
        dVar304 = auVar289._8_8_;
        local_9e8 = auVar373._0_8_;
        dStack_9e0 = auVar373._8_8_;
        local_6f8 = auVar286._0_8_;
        dStack_6f0 = auVar286._8_8_;
        local_738 = auVar137._0_8_;
        dStack_730 = auVar137._8_8_;
        local_bb8 = auVar94._0_8_;
        local_788 = auVar96._0_8_;
        dStack_780 = auVar96._8_8_;
        local_768 = auVar142._0_8_;
        dStack_760 = auVar142._8_8_;
        dStack_bb0 = auVar94._8_8_;
        if (dVar16 < 0.27) {
          local_a58 = dVar75 * 24.0 * dVar262 + dVar349 * 48.0 * dVar208;
        }
        else {
          auVar376._0_8_ = local_758 * dVar44;
          auVar376._8_8_ = dStack_740 * dVar44;
          auVar289 = divpd(auVar376,_DAT_00fc55f0);
          auVar344._0_8_ = local_748 * dVar44;
          auVar344._8_8_ = dVar304 * dVar44;
          auVar313 = divpd(auVar344,_DAT_00fc5600);
          auVar240._0_8_ = -dStack_9e0 * dVar44;
          auVar240._8_8_ = local_9e8 * dVar44;
          auVar373 = divpd(auVar240,_DAT_00fc5610);
          auVar331._0_8_ = local_6f8 * dVar44;
          auVar331._8_8_ = dVar277 * dVar44;
          auVar140 = divpd(auVar331,_DAT_00fc5620);
          auVar396._0_8_ = dStack_6f0 * dVar44;
          auVar396._8_8_ = dStack_730 * dVar44;
          auVar286 = divpd(auVar396,_DAT_00fc5630);
          auVar314._0_8_ = local_bb8 * dVar44;
          auVar314._8_8_ = local_738 * dVar44;
          auVar96 = divpd(auVar314,_DAT_00fc5640);
          auVar212._0_8_ = dStack_bb0 * dVar44;
          auVar212._8_8_ = dVar347 * dVar44;
          auVar137 = divpd(auVar212,_DAT_00fc5650);
          auVar290._0_8_ = local_788 * dVar44;
          auVar290._8_8_ = local_768 * dVar44;
          auVar94 = divpd(auVar290,_DAT_00fc5660);
          auVar355._0_8_ = dVar44 * dStack_780;
          auVar355._8_8_ = dVar44 * dStack_760;
          auVar142 = divpd(auVar355,_DAT_00fc5670);
          local_a58 = auVar142._8_8_ +
                      auVar94._8_8_ +
                      auVar137._8_8_ +
                      auVar96._8_8_ +
                      auVar286._8_8_ +
                      auVar140._8_8_ +
                      (((auVar289._0_8_ - auVar289._8_8_) + auVar313._0_8_) - auVar313._8_8_) +
                      (dStack_750 * dVar44) / 8.121312287389663e+33 +
                      auVar142._0_8_ +
                      auVar94._0_8_ +
                      auVar137._0_8_ +
                      auVar96._0_8_ +
                      auVar286._0_8_ +
                      auVar140._0_8_ +
                      dVar45 * -3.0438311688311688e-05 * dVar44 +
                      (dVar256 * dVar44) / 1920.0 +
                      dVar308 * dVar44 + auVar373._8_8_ + auVar373._0_8_;
        }
        dVar46 = dVar32 / dVar194;
        dVar124 = dVar33 * 0.24256886666666666 * dVar22 + dVar121 * -0.11279007555555555;
        dVar47 = dVar79 / dVar194;
        dVar125 = dVar20 * dVar47;
        uVar11 = -(ulong)(0.32 < dVar16);
        dVar203 = (double)(uVar11 & (ulong)dVar276);
        auVar98._0_8_ = dVar306 * dVar263;
        auVar98._8_8_ = dVar263;
        auVar241._0_8_ = dVar390 * auVar98._0_8_;
        auVar241._8_8_ = dVar390 * dVar263;
        auVar143._0_8_ = auVar98._0_8_ * dVar192;
        auVar143._8_8_ = dVar263 * dVar192;
        dVar390 = 1.0 / auVar143._8_8_;
        auVar213._0_8_ = dVar192 * auVar241._0_8_;
        auVar213._8_8_ = dVar192 * auVar241._8_8_;
        auVar137 = divpd(_DAT_00f56e20,auVar213);
        auVar356._8_8_ = auVar241._8_8_;
        auVar356._0_8_ = auVar143._0_8_;
        dVar306 = (1.0 / auVar241._8_8_) * -0.001530612244897959;
        dVar263 = 0.0;
        if (dVar16 <= 0.32) {
          dVar263 = dVar276;
        }
        dVar278 = 1.0 / auVar241._0_8_;
        auVar96 = divpd(auVar341,auVar98);
        dVar324 = auVar96._8_8_;
        auVar94 = divpd(auVar341,auVar241);
        dVar305 = auVar94._8_8_;
        auVar140 = divpd(auVar341,auVar143);
        auVar142 = divpd(auVar341,auVar213);
        dVar399 = auVar142._8_8_;
        auVar373 = divpd(auVar388,auVar98);
        auVar377._8_8_ = dVar364;
        auVar377._0_8_ = 0x3ff0000000000000;
        auVar313 = divpd(auVar377,auVar356);
        dVar276 = dVar364 / auVar241._0_8_;
        dVar126 = dVar258 * dVar258 * -1105920.0;
        dVar335 = dVar258 * dVar263 * -2880.0 +
                  dVar80 * dVar263 * 768.0 +
                  dVar263 * -8.0 + dVar126 * dVar263 + dVar174 * 26880.0 * dVar263;
        dVar328 = 1.0 / dVar275;
        dVar329 = dVar328 * dVar334;
        dVar385 = dVar35 * dVar263;
        dVar230 = dVar173 * dVar263 * 30720.0 +
                  dVar19 * dVar263 * 448.0 + dVar275 * dVar263 * -5760.0;
        dVar350 = dVar80 * dVar259 * 72.0;
        dVar204 = dVar19 * 1.7724538509055159 * 240.0;
        dVar83 = dVar119 * dVar35 * -2.0;
        dVar178 = dVar389 * dVar263 * dVar83 +
                  dVar204 * dVar263 * dVar37 +
                  dVar198 * dVar230 + dVar350 * dVar263 + dVar335 * dVar35 + dVar329 * dVar385 * 0.5
        ;
        dVar48 = local_d58 * dVar46;
        dVar330 = dVar41 * dVar125;
        local_da8 = auVar137._0_8_;
        dStack_da0 = auVar137._8_8_;
        dVar383 = auVar313._8_8_;
        local_a08 = auVar140._0_8_;
        dStack_a00 = auVar140._8_8_;
        local_d68 = auVar373._0_8_;
        dStack_d60 = auVar373._8_8_;
        dVar309 = auVar96._0_8_;
        dVar279 = auVar94._0_8_;
        dVar392 = auVar142._0_8_;
        dVar367 = auVar313._0_8_;
        if (dVar16 < 0.32) {
          dVar49 = dVar263 * 1.1428571428571428 * dVar257;
          dVar368 = dVar19 * 1.1428571428571428 * dVar178;
        }
        else {
          auVar315._0_8_ = dVar309 * dVar203;
          auVar315._8_8_ = dVar324 * dVar203;
          auVar140 = divpd(auVar315,_DAT_00fc5680);
          auVar291._0_8_ = dVar279 * dVar203;
          auVar291._8_8_ = dVar305 * dVar203;
          auVar96 = divpd(auVar291,_DAT_00fc5690);
          auVar58._0_8_ = local_a08 * dVar203;
          auVar58._8_8_ = dStack_a00 * dVar203;
          auVar137 = divpd(auVar58,_DAT_00fc56a0);
          auVar397._0_8_ = dVar392 * dVar203;
          auVar397._8_8_ = dVar399 * dVar203;
          auVar313 = divpd(auVar397,_DAT_00fc56b0);
          auVar59._0_8_ = local_d68 * dVar203;
          auVar59._8_8_ = dStack_d60 * dVar203;
          auVar373 = divpd(auVar59,_DAT_00fc56c0);
          auVar60._0_8_ = dVar276 * dVar203;
          auVar60._8_8_ = dVar383 * dVar203;
          auVar94 = divpd(auVar60,_DAT_00fc56d0);
          dVar49 = auVar94._0_8_;
          dVar368 = ((((((((((((local_da8 * dVar203) / 8272281600.0 +
                              (dStack_da0 * dVar203) / -210862080.0 +
                              (dVar367 * dVar203) / 6150144.0 +
                              dVar390 * -4.6972703222703225e-06 * dVar203 +
                              dVar306 * dVar203 + (dVar278 * dVar203) / 9408.0) - auVar140._8_8_) +
                            auVar140._0_8_) - auVar96._8_8_) + auVar96._0_8_) - auVar137._8_8_) +
                        auVar137._0_8_) - auVar313._8_8_) + auVar313._0_8_) - auVar373._8_8_) +
                    auVar373._0_8_) - auVar94._8_8_;
        }
        dVar15 = dVar14 / (dVar15 * dVar15);
        dVar369 = (dVar368 + dVar49) * 1.8171205928321397;
        dVar336 = dVar20 * dVar369;
        dVar121 = dVar121 * dVar79;
        dVar127 = local_ed8 * dVar20;
        dVar231 = dVar200 * 1.8171205928321397 * dVar127;
        dVar49 = dVar22 * 1.5874010519681996;
        dVar161 = dVar41 * dVar47;
        dVar264 = dVar49 * dVar161;
        dVar368 = dVar34 * 1.8171205928321397 * -0.1728395061728395;
        dVar128 = dVar336 * 0.026329605555555555;
        dVar232 = dVar231 * -0.010531842222222223;
        dVar162 = dVar232 * dVar264 +
                  dVar225 * -0.07021228148148148 * dVar121 +
                  dVar128 * dVar112 +
                  dVar368 * dVar330 +
                  dVar124 * dVar196 * 0.43209876543209874 * dVar28 +
                  dVar78 * local_a58 * 0.43209876543209874 * dVar28 +
                  local_ba8 * dVar32 + (dVar41 * dVar48) / -5.0;
        dVar129 = 0.0;
        if (dVar1 < dVar159) {
          dVar129 = dVar175 * dVar162 + dVar15 * -0.9847450218426964 * dVar38 * 0.125;
        }
        dVar50 = dVar12 + dVar12;
        pdVar3 = out->vrho;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar6 = (long)(p->dim).vrho * sVar7;
          pdVar3[lVar6] = dVar50 * dVar129 + dVar39 + pdVar3[lVar6];
        }
        dVar130 = dVar172 * 0.1504548888888889 * dVar49 +
                  dVar193 * 0.01075979618490518 * local_ed8 * 1.2599210498948732 * dVar157;
        dVar39 = dVar113 * dVar130;
        dVar131 = dVar18 * dVar120 * dVar17;
        dVar163 = (double)(~-(ulong)(dVar70 < 1e-10) & (ulong)((dVar39 * dVar131) / -180.0));
        local_878 = dVar163;
        if (dVar16 <= 1.35) {
          local_878 = 0.0;
        }
        dVar24 = -dVar24;
        dVar370 = (double)(~uVar9 & (ulong)dVar163);
        dVar280 = dVar370 * dVar24 * dVar27 + dVar346 * dVar370 + dVar226 * dVar370 * dVar27 * 0.5;
        dVar351 = dVar73 * dVar280 + (dVar370 + dVar370) * dVar115 + dVar177 * dVar370;
        if (dVar16 < 1.35) {
          local_4e8 = dVar370 * -2.6666666666666665 * dVar74 +
                      dVar71 * -2.6666666666666665 * dVar351;
        }
        else {
          auVar61._0_8_ = dVar348 * local_878;
          auVar61._8_8_ = dVar362 * local_878;
          auVar144._0_8_ = dVar366 * local_878;
          auVar144._8_8_ = dVar382 * local_878;
          auVar292._0_8_ = dVar365 * local_878;
          auVar292._8_8_ = dVar381 * local_878;
          auVar357._0_8_ = -dVar160 * local_878;
          auVar357._8_8_ = dVar43 * local_878;
          auVar96 = divpd(auVar357,_DAT_00f630f0);
          auVar94 = divpd(auVar292,_DAT_00f63100);
          auVar373 = divpd(auVar144,_DAT_00f63110);
          auVar137 = divpd(auVar61,_DAT_00f63120);
          local_4e8 = ((((((auVar96._8_8_ + auVar96._0_8_) - auVar94._8_8_) + auVar94._0_8_) -
                        auVar373._8_8_) + auVar373._0_8_) - auVar137._8_8_) + auVar137._0_8_;
        }
        dVar337 = 0.0;
        if (dVar16 <= 0.27) {
          dVar337 = dVar163;
        }
        dVar265 = dVar13 * dVar337 * 40.0 - dVar202 * dVar337;
        dVar281 = dVar29 * dVar337;
        dVar282 = dVar123 * dVar337 +
                  dVar337 * 10.0 * 1.7724538509055159 * dVar30 +
                  dVar13 * dVar337 * -72.0 + dVar265 * dVar29 + dVar229 * dVar281 * 0.5 +
                  dVar202 * dVar337;
        dVar205 = (double)(uVar10 & (ulong)dVar163);
        if (dVar16 < 0.27) {
          dVar371 = dVar75 * 24.0 * dVar282 + dVar349 * 48.0 * dVar337;
        }
        else {
          auVar272._0_8_ = local_758 * dVar205;
          auVar272._8_8_ = dStack_740 * dVar205;
          auVar289 = divpd(auVar272,_DAT_00fc55f0);
          auVar145._0_8_ = local_748 * dVar205;
          auVar145._8_8_ = dVar304 * dVar205;
          auVar137 = divpd(auVar145,_DAT_00fc5600);
          auVar183._0_8_ = -dStack_9e0 * dVar205;
          auVar183._8_8_ = local_9e8 * dVar205;
          auVar140 = divpd(auVar183,_DAT_00fc5610);
          auVar242._0_8_ = local_6f8 * dVar205;
          auVar242._8_8_ = dVar277 * dVar205;
          auVar142 = divpd(auVar242,_DAT_00fc5620);
          auVar146._0_8_ = dStack_6f0 * dVar205;
          auVar146._8_8_ = dStack_730 * dVar205;
          auVar373 = divpd(auVar146,_DAT_00fc5630);
          auVar378._0_8_ = local_bb8 * dVar205;
          auVar378._8_8_ = local_738 * dVar205;
          auVar286 = divpd(auVar378,_DAT_00fc5640);
          auVar147._0_8_ = dStack_bb0 * dVar205;
          auVar147._8_8_ = dVar347 * dVar205;
          auVar94 = divpd(auVar147,_DAT_00fc5650);
          auVar184._0_8_ = local_788 * dVar205;
          auVar184._8_8_ = local_768 * dVar205;
          auVar313 = divpd(auVar184,_DAT_00fc5660);
          auVar148._0_8_ = dStack_780 * dVar205;
          auVar148._8_8_ = dStack_760 * dVar205;
          auVar96 = divpd(auVar148,_DAT_00fc5670);
          dVar371 = auVar96._8_8_ +
                    auVar313._8_8_ +
                    auVar94._8_8_ +
                    auVar286._8_8_ +
                    auVar373._8_8_ +
                    auVar142._8_8_ +
                    (((auVar289._0_8_ - auVar289._8_8_) + auVar137._0_8_) - auVar137._8_8_) +
                    (dStack_750 * dVar205) / 8.121312287389663e+33 +
                    auVar96._0_8_ +
                    auVar313._0_8_ +
                    auVar94._0_8_ +
                    auVar286._0_8_ +
                    auVar373._0_8_ +
                    auVar142._0_8_ +
                    dVar45 * dVar205 * -3.0438311688311688e-05 +
                    (dVar256 * dVar205) / 1920.0 +
                    dVar308 * dVar205 + auVar140._8_8_ + auVar140._0_8_;
        }
        dVar51 = (double)(uVar11 & (ulong)dVar163);
        dVar233 = 0.0;
        if (dVar16 <= 0.32) {
          dVar233 = dVar163;
        }
        dVar163 = dVar22 * dVar196 * 1.5874010519681996;
        dVar386 = dVar174 * dVar233 * 26880.0 +
                  dVar258 * dVar233 * -2880.0 +
                  dVar80 * dVar233 * 768.0 + dVar126 * dVar233 + dVar233 * -8.0;
        dVar393 = dVar35 * dVar233;
        dVar338 = dVar173 * dVar233 * 30720.0 +
                  dVar19 * dVar233 * 448.0 + dVar275 * dVar233 * -5760.0;
        dVar132 = dVar389 * dVar83 * dVar233 +
                  dVar204 * dVar37 * dVar233 +
                  dVar198 * dVar338 + dVar350 * dVar233 + dVar386 * dVar35 + dVar329 * dVar393 * 0.5
        ;
        dVar206 = dVar130 * dVar125;
        if (dVar16 < 0.32) {
          dVar283 = dVar19 * 1.1428571428571428 * dVar132 + dVar233 * 1.1428571428571428 * dVar257;
        }
        else {
          auVar99._0_8_ = dVar309 * dVar51;
          auVar99._8_8_ = dVar324 * dVar51;
          auVar137 = divpd(auVar99,_DAT_00fc5680);
          auVar100._0_8_ = dVar279 * dVar51;
          auVar100._8_8_ = dVar305 * dVar51;
          auVar373 = divpd(auVar100,_DAT_00fc5690);
          auVar101._0_8_ = local_a08 * dVar51;
          auVar101._8_8_ = dStack_a00 * dVar51;
          auVar94 = divpd(auVar101,_DAT_00fc56a0);
          auVar102._0_8_ = dVar392 * dVar51;
          auVar102._8_8_ = dVar399 * dVar51;
          auVar96 = divpd(auVar102,_DAT_00fc56b0);
          auVar103._0_8_ = local_d68 * dVar51;
          auVar103._8_8_ = dStack_d60 * dVar51;
          auVar140 = divpd(auVar103,_DAT_00fc56c0);
          auVar104._0_8_ = dVar276 * dVar51;
          auVar104._8_8_ = dVar383 * dVar51;
          auVar313 = divpd(auVar104,_DAT_00fc56d0);
          dVar283 = (((((((((((((local_da8 * dVar51) / 8272281600.0 +
                               (dStack_da0 * dVar51) / -210862080.0 +
                               (dVar367 * dVar51) / 6150144.0 +
                               dVar390 * dVar51 * -4.6972703222703225e-06 +
                               dVar306 * dVar51 + (dVar278 * dVar51) / 9408.0) - auVar137._8_8_) +
                             auVar137._0_8_) - auVar373._8_8_) + auVar373._0_8_) - auVar94._8_8_) +
                         auVar94._0_8_) - auVar96._8_8_) + auVar96._0_8_) - auVar140._8_8_) +
                     auVar140._0_8_) - auVar313._8_8_) + auVar313._0_8_;
        }
        dVar394 = dVar20 * dVar283 * 1.8171205928321397;
        dVar339 = dVar49 * dVar79;
        dVar133 = dVar130 * dVar47;
        dVar234 = dVar49 * dVar133;
        dVar84 = dVar232 * dVar234 +
                 dVar225 * 0.026329605555555555 * dVar339 +
                 dVar394 * 0.026329605555555555 * dVar112 +
                 dVar368 * dVar206 +
                 dVar163 * 0.018276169650205763 * dVar28 +
                 dVar78 * dVar371 * 0.43209876543209874 * dVar28 +
                 local_4e8 * dVar32 + (dVar130 * dVar48) / -5.0;
        dVar85 = (double)(~uVar8 & (ulong)(dVar175 * dVar84));
        pdVar3 = out->vsigma;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar6 = (long)(p->dim).vsigma * sVar7;
          pdVar3[lVar6] = dVar50 * dVar85 + pdVar3[lVar6];
        }
        pdVar3 = out->vlapl;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x8002U) == 0)) {
          lVar6 = (long)(p->dim).vlapl * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        }
        dVar52 = dVar14 * 1.4422495703074083;
        dVar86 = dVar307 * dVar196 * dVar52;
        dVar235 = dVar20 * 2.884499140614817 * dVar79;
        dVar134 = (double)(~uVar8 & (ulong)(dVar86 * 0.01610215409462904 * dVar235));
        pdVar3 = out->vtau;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
          lVar6 = (long)(p->dim).vtau * sVar7;
          pdVar3[lVar6] = dVar50 * dVar134 + pdVar3[lVar6];
        }
        dVar111 = dVar111 * (dVar21 / dVar23);
        dVar395 = dVar172 * 1.4711144691358025 * dVar111 +
                  dVar254 * dVar193 * 0.18172100223395413 * (dVar18 / (dVar12 * dVar223 * dVar23));
        dVar194 = dVar194 * dVar194;
        dVar254 = dVar41 * dVar41;
        dVar53 = dVar40 * 1.5874010519681996;
        dVar54 = (dVar54 / dVar194) * dVar18;
        local_f78 = 0.0;
        if (1e-10 <= dVar70) {
          local_f78 = (dVar113 * dVar395 * dVar131) / -180.0 +
                      dVar17 * 0.006111111111111111 * dVar54 * dVar113 * dVar254 +
                      dVar69 * 0.024691358024691357 * 1.4422495703074083 * (dVar18 / dVar223) *
                      dVar114 + (dVar113 * dVar41 * dVar307 * dVar120 * dVar17) / 270.0;
        }
        dVar325 = dVar273 / dVar325;
        dVar69 = 1.0 / (dVar72 * dVar72);
        dVar310 = dVar69 / dVar71;
        dVar72 = dVar69 / dVar72;
        dVar114 = dVar27 * dVar226 + dVar27 * dVar226;
        local_1c8 = auVar312._0_8_;
        dStack_1c0 = auVar312._8_8_;
        if (dVar16 < 1.35) {
          dVar266 = (double)(~uVar9 & (ulong)local_f78);
          dVar311 = dVar122 * dVar122;
          local_348 = dVar71 * -2.6666666666666665 *
                      ((dVar266 * dVar24 * dVar27 +
                       dVar346 * dVar266 +
                       ((dVar311 * -4.0 * dVar195 +
                        dVar72 * dVar311 * dVar27 * 0.25 +
                        dVar69 * -2.0 * dVar311 * dVar27 + dVar226 * dVar266 * dVar27 * 0.5) -
                       dVar311 * dVar26 * dVar27)) * dVar73 +
                      dVar122 * 4.0 * dVar176 +
                      (dVar266 + dVar266) * dVar115 +
                      dVar177 * dVar266 + (dVar114 * dVar311 - dVar311 * dVar310 * dVar27 * 0.5)) +
                      dVar266 * -2.6666666666666665 * dVar74 +
                      dVar122 * -5.333333333333333 * dVar227;
        }
        else {
          dVar311 = dVar42 * dVar42;
          dVar266 = (double)(uVar9 & (ulong)local_f78);
          auVar332._0_8_ = dVar302 * dVar311;
          auVar332._8_8_ = dVar381 * dVar266;
          auVar140 = divpd(auVar332,_DAT_00f63130);
          auVar293._0_8_ = dVar365 * dVar266;
          auVar293._8_8_ = local_1c8 * dVar311;
          auVar96 = divpd(auVar293,_DAT_00f63140);
          auVar62._0_8_ = dStack_1c0 * dVar311;
          auVar62._8_8_ = dVar382 * dVar266;
          auVar137 = divpd(auVar62,_DAT_00f63150);
          auVar214._0_8_ = dVar366 * dVar266;
          auVar214._8_8_ = dVar224 * dVar311;
          auVar94 = divpd(auVar214,_DAT_00f63160);
          auVar105._0_8_ = dVar311 * dVar273;
          auVar105._8_8_ = dVar266 * dVar362;
          auVar312 = divpd(auVar105,_DAT_00f63170);
          auVar106._0_8_ = dVar348 * dVar266;
          auVar106._8_8_ = dVar325 * dVar311;
          auVar373 = divpd(auVar106,_DAT_00f63180);
          local_348 = ((((((((((dVar266 * dVar43) / 240.0 +
                               (dVar255 * dVar311) / -48.0 +
                               (dVar160 * dVar266) / -18.0 + (dVar25 * dVar311) / 6.0 +
                              auVar140._0_8_) - auVar140._8_8_) - auVar96._8_8_) + auVar96._0_8_ +
                           auVar137._0_8_) - auVar137._8_8_) - auVar94._8_8_) + auVar94._0_8_ +
                        auVar312._0_8_) - auVar312._8_8_) - auVar373._8_8_) + auVar373._0_8_;
        }
        dVar192 = dVar364 / dVar192;
        dVar335 = dVar335 * dVar328;
        dVar311 = (1.0 / dVar174) * dVar334;
        dVar230 = dVar230 * dVar80;
        dVar266 = (1.0 / dVar258) * dVar334 * -1.5;
        dVar259 = dVar259 * dVar19 * 144.0;
        dVar334 = -dVar119 * (1.0 / dVar173);
        dVar119 = dVar119 * dVar35 * 4.0;
        dStack_630 = auVar93._8_8_;
        local_638 = auVar93._0_8_;
        local_3e8 = auVar92._0_8_;
        dStack_3e0 = auVar92._8_8_;
        local_458 = auVar209._0_8_;
        dStack_450 = auVar209._8_8_;
        local_6a8 = auVar90._0_8_;
        dStack_6a0 = auVar90._8_8_;
        if (dVar16 < 0.32) {
          dVar87 = (double)(~uVar11 & (ulong)local_f78);
          dVar340 = dVar263 * dVar263;
          dVar88 = dVar35 * dVar340;
          dVar87 = dVar19 * 1.1428571428571428 *
                   (dVar389 * dVar87 * dVar83 +
                   dVar328 * dVar340 * dVar119 +
                   dVar88 * dVar334 +
                   ((dVar37 * dVar87 * dVar204 +
                    dVar340 * 425.3889242173238 * dVar37 +
                    (dVar258 * dVar340 * 153600.0 +
                    dVar80 * dVar340 * -17280.0 +
                    dVar340 * 448.0 +
                    dVar173 * 30720.0 * dVar87 +
                    dVar19 * 448.0 * dVar87 + dVar275 * -5760.0 * dVar87) * dVar198 +
                    dVar350 * dVar87 +
                    dVar230 * 144.0 * dVar263 +
                    dVar340 * dVar259 +
                    dVar329 * dVar35 * dVar87 * 0.5 +
                    dVar266 * dVar88 +
                    (dVar275 * dVar340 * -11520.0 +
                    dVar19 * dVar340 * 1536.0 +
                    dVar87 * -8.0 +
                    ((dVar173 * 161280.0 * dVar340 +
                     dVar174 * 26880.0 * dVar87 +
                     dVar126 * dVar87 + dVar80 * 768.0 * dVar87 + dVar258 * -2880.0 * dVar87) -
                    dVar197 * 8847360.0 * dVar340)) * dVar35 + dVar385 * dVar335 +
                    dVar311 * dVar88 * 0.25) - dVar340 * dVar36 * 480.0 * dVar35)) +
                   dVar87 * 1.1428571428571428 * dVar257 + dVar263 * 2.2857142857142856 * dVar178;
        }
        else {
          dVar340 = dVar203 * dVar203;
          dVar87 = (double)(uVar11 & (ulong)local_f78);
          auVar63._0_8_ = dVar199 * dVar340;
          auVar63._8_8_ = auVar97._0_8_ * dVar340;
          auVar137 = divpd(auVar63,_DAT_00fc5a50);
          auVar64._0_8_ = local_3e8 * dVar340;
          auVar64._8_8_ = dStack_3e0 * dVar340;
          auVar312 = divpd(auVar64,_DAT_00fc5a60);
          auVar243._0_8_ = local_458 * dVar340;
          auVar243._8_8_ = dStack_450 * dVar340;
          auVar313 = divpd(auVar243,_DAT_00fc5a70);
          auVar294._0_8_ = dVar340 * local_6a8;
          auVar294._8_8_ = dVar340 * dStack_6a0;
          auVar142 = divpd(auVar294,_DAT_00fc6340);
          auVar149._0_8_ = dVar340 * dVar192;
          auVar149._8_8_ = dVar87 * dVar276;
          auVar373 = divpd(auVar149,_DAT_00fc6350);
          auVar169._0_8_ = local_d68 * dVar87;
          auVar169._8_8_ = dStack_d60 * dVar87;
          auVar93 = divpd(auVar169,_DAT_00fc56c0);
          auVar170._0_8_ = dVar383 * dVar87;
          auVar170._8_8_ = dVar399 * dVar87;
          auVar94 = divpd(auVar170,_DAT_00fc6360);
          auVar171._0_8_ = dVar279 * dVar87;
          auVar171._8_8_ = dVar392 * dVar87;
          auVar96 = divpd(auVar171,_DAT_00fc6370);
          auVar150._0_8_ = local_a08 * dVar87;
          auVar150._8_8_ = dStack_a00 * dVar87;
          auVar90 = divpd(auVar150,_DAT_00fc56a0);
          auVar185._0_8_ = dVar87 * dVar309;
          auVar185._8_8_ = dVar87 * dVar305;
          auVar140 = divpd(auVar185,_DAT_00fc59a0);
          auVar65._0_8_ = dStack_da0 * dVar87;
          auVar65._8_8_ = dStack_620 * dVar340;
          auVar209 = divpd(auVar65,_DAT_00fc6380);
          auVar151._0_8_ = local_da8 * dVar87;
          auVar151._8_8_ = local_628 * dVar340;
          auVar92 = divpd(auVar151,_DAT_00fc6390);
          dVar87 = auVar92._8_8_ +
                   auVar209._8_8_ +
                   dVar82 * 4.22754329004329e-05 * dVar340 +
                   (dVar260 * dVar340) / -1344.0 +
                   dVar81 * 0.007653061224489796 * dVar340 +
                   (((((((((dVar87 * dVar278) / 9408.0 +
                          dVar306 * dVar87 +
                          (dVar367 * dVar87) / 6150144.0 +
                          dVar390 * -4.6972703222703225e-06 * dVar87 +
                          (dVar324 * dVar87) / -363245076480.0) - auVar137._8_8_) + auVar137._0_8_)
                       - auVar312._8_8_) + auVar312._0_8_) - auVar313._8_8_) + auVar313._0_8_) -
                   auVar142._8_8_) + auVar142._0_8_ +
                   auVar92._0_8_ +
                   auVar209._0_8_ +
                   ((((auVar96._8_8_ +
                       (((((auVar373._8_8_ +
                           (((dStack_630 * dVar340) / 1.6551271225536316e+28 +
                            (local_638 * dVar340) / -2.0268157175919785e+26 +
                            (dVar327 * dVar340) / 2.614442878957712e+24 +
                            (dVar340 * dVar364) / -3.5634170434773477e+22) - auVar373._0_8_)) -
                          auVar93._8_8_) + auVar93._0_8_) - auVar94._0_8_) - auVar94._8_8_) +
                      auVar96._0_8_) - auVar90._8_8_) + auVar90._0_8_ + auVar140._0_8_) -
                   auVar140._8_8_);
        }
        dVar340 = dVar79 / dVar194;
        dVar158 = dVar323 / dVar158;
        dVar262 = dVar262 * dVar13;
        dVar261 = dVar261 * dVar228;
        dVar88 = 1.0 / (dVar75 * dVar75);
        dVar387 = (dVar88 / dVar75) * dVar117;
        dVar117 = dVar88 * dVar117 * -1.5;
        local_478 = auVar267._0_8_;
        dStack_470 = auVar267._8_8_;
        local_468 = auVar138._0_8_;
        dStack_460 = auVar138._8_8_;
        local_4c8 = auVar89._0_8_;
        dStack_4c0 = auVar89._8_8_;
        local_6b8 = auVar55._0_8_;
        dStack_6b0 = auVar55._8_8_;
        if (dVar16 < 0.27) {
          local_f78 = (double)(~uVar10 & (ulong)local_f78);
          dVar164 = dVar208 * dVar208;
          dVar135 = dVar75 * 768.0 * dVar164;
          dVar164 = dVar75 * 24.0 *
                    (dVar123 * local_f78 +
                    ((local_f78 * 10.0 * 1.7724538509055159 * dVar30 +
                     dVar13 * local_f78 * -72.0 +
                     dVar164 * -72.0 +
                     dVar229 * local_f78 * dVar29 * 0.5 +
                     dVar117 * dVar164 * dVar29 +
                     (((dVar164 * 40.0 + dVar13 * local_f78 * 40.0) - dVar135) - dVar202 * local_f78
                     ) * dVar29 + dVar391 * dVar261 + dVar387 * dVar164 * dVar29 * 0.25 + dVar135 +
                     dVar202 * local_f78) - dVar164 * dVar88 * 5.0 * dVar29)) +
                    dVar349 * 48.0 * local_f78 + dVar164 * 48.0 * dVar326 + dVar262 * 96.0 * dVar208
          ;
        }
        else {
          dVar164 = dVar44 * dVar44;
          local_f78 = (double)((ulong)local_f78 & uVar10);
          auVar244._0_8_ = -dStack_780 * local_f78;
          auVar244._8_8_ = local_758 * local_f78;
          auVar55 = divpd(auVar244,_DAT_00fc63b0);
          auVar295._0_8_ = local_bb8 * local_f78;
          auVar295._8_8_ = dStack_bb0 * local_f78;
          auVar267 = divpd(auVar295,_DAT_00fc57b0);
          auVar245._0_8_ = local_6f8 * local_f78;
          auVar245._8_8_ = dStack_6f0 * local_f78;
          auVar89 = divpd(auVar245,_DAT_00fc57c0);
          auVar296._0_8_ = local_768 * local_f78;
          auVar296._8_8_ = dStack_760 * local_f78;
          auVar209 = divpd(auVar296,_DAT_00fc57e0);
          auVar316._0_8_ = local_738 * local_f78;
          auVar316._8_8_ = dStack_750 * local_f78;
          auVar92 = divpd(auVar316,_DAT_00fc57f0);
          auVar297._0_8_ = dVar347 * local_f78;
          auVar297._8_8_ = dVar304 * local_f78;
          auVar373 = divpd(auVar297,_DAT_00fc5800);
          auVar298._0_8_ = dVar277 * local_f78;
          auVar298._8_8_ = dStack_730 * local_f78;
          auVar90 = divpd(auVar298,_DAT_00fc5ad0);
          auVar152._0_8_ = dStack_740 * local_f78;
          auVar152._8_8_ = dStack_9e0 * local_f78;
          auVar137 = divpd(auVar152,_DAT_00fc63c0);
          auVar246._0_8_ = local_748 * local_f78;
          auVar246._8_8_ = local_9e8 * local_f78;
          auVar138 = divpd(auVar246,_DAT_00fc63d0);
          auVar153._0_8_ = (double)local_b98._8_8_ * dVar164;
          auVar153._8_8_ = dStack_6b0 * dVar164;
          auVar312 = divpd(auVar153,_DAT_00fc63e0);
          dVar164 = dVar164 * dVar380 * 6.419508807886076e-20 +
                    auVar312._8_8_ +
                    (local_6b8 * dVar164) / 4.98616712036352e+15 +
                    local_4c8 * -9.963564958965524e-15 * dVar164 +
                    (dStack_4c0 * dVar164) / 2207210536960.0 +
                    dVar77 * -1.8676367771303596e-11 * dVar164 +
                    local_468 * -5.2947108149957596e-33 * dVar164 +
                    dVar116 * 4.588885732696935e-31 * dVar164 +
                    (dVar333 * dVar164) / -2.638135332978604e+28 +
                    local_478 * 2.9767152251494278e-27 * dVar164 +
                    (dVar303 * dVar164) / -4.5123912079969836e+24 +
                    auVar138._8_8_ +
                    auVar137._8_8_ +
                    (dVar256 * local_f78) / 1920.0 +
                    dVar308 * local_f78 +
                    ((dVar45 * local_f78 * -3.0438311688311688e-05 +
                      ((auVar55._8_8_ + auVar55._0_8_ + auVar267._0_8_) - auVar267._8_8_) +
                     auVar89._0_8_) - auVar89._8_8_) +
                    (local_f78 * local_788) / 1017328435200.0 +
                    auVar138._0_8_ +
                    auVar137._0_8_ +
                    (((((auVar92._8_8_ + (auVar209._0_8_ - auVar209._8_8_) + auVar92._0_8_) -
                       auVar373._0_8_) - auVar373._8_8_) + auVar90._0_8_) - auVar90._8_8_) +
                    dVar164 * dVar363 * 6.895252899056353e-10 +
                    auVar312._0_8_ +
                    dStack_470 * 6.297278025793651e-07 * dVar164 +
                    dVar384 * -1.475575206043956e-05 * dVar164 +
                    dVar76 * 0.0002739448051948052 * dVar164 +
                    dVar118 * -0.0036458333333333334 * dVar164 +
                    dVar274 * 0.026785714285714284 * dVar164 +
                    dVar158 * -6.156813072833613e-37 * dVar164 +
                    dVar323 * -1.0330674055506187e-21 * dVar164 +
                    (dVar31 * dVar164) / 6.413496239867403e+22 +
                    (dStack_460 * dVar164) / 1.7135877778106135e+34;
        }
        dVar165 = dVar20 * dVar340;
        dVar369 = dVar369 * dVar127;
        dVar352 = dVar124 * dVar196 * 1.8171205928321397;
        dVar207 = dVar78 * local_a58 * 1.8171205928321397;
        dVar135 = dVar231 * 0.01474457911111111;
        dVar136 = dVar34 * 1.8171205928321397 * 0.2419753086419753;
        dVar166 = local_d58 * (dVar32 / dVar194) * 0.24;
        dVar194 = 0.0;
        if (dVar1 < dVar159) {
          dVar194 = (dVar207 * -0.345679012345679 * dVar330 +
                    dVar395 * dVar125 * dVar368 +
                    dVar352 * -0.345679012345679 * dVar330 +
                    dVar254 * dVar166 +
                    (dVar395 * dVar48) / -5.0 +
                    local_ba8 * dVar46 * -0.4 * dVar41 +
                    dVar164 * dVar78 * 0.43209876543209874 * dVar28 +
                    dVar124 * local_a58 * 0.8641975308641975 * dVar28 +
                    (dVar33 * -0.6468503111111111 * dVar40 + dVar111 * 0.41356361037037037) *
                    dVar196 * 0.43209876543209874 * dVar28 +
                    dVar87 * 1.8171205928321397 * dVar20 * 0.026329605555555555 * dVar112 +
                    dVar254 * dVar165 * dVar136 +
                    local_348 * dVar32 +
                    dVar369 * -0.021063684444444446 * dVar264 +
                    dVar336 * -0.14042456296296296 * dVar121 +
                    dVar395 * dVar47 * dVar49 * dVar232 + dVar254 * dVar340 * dVar49 * dVar135 +
                    dVar225 * 0.25744503209876546 * dVar111 * dVar79 +
                    dVar231 * 0.056169825185185186 * dVar53 * dVar161) * dVar175 +
                    dVar15 * 0.9847450218426964 * dVar162 * -0.25 +
                    ((dVar21 / dVar12) * dVar14 * 0.9847450218426964 * dVar38) / 12.0;
        }
        pdVar3 = out->v2rho2;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar6 = (long)(p->dim).v2rho2 * sVar7;
          pdVar3[lVar6] = dVar194 * dVar50 + dVar129 * 4.0 + pdVar3[lVar6];
        }
        dVar14 = dVar172 * -0.40121303703703703 * dVar53 +
                 dVar201 * local_ed8 * 1.2599210498948732 * dVar193 * -0.057385579652827624;
        local_f78 = 0.0;
        if (1e-10 <= dVar70) {
          local_f78 = (dVar113 * dVar14 * dVar131) / -180.0 +
                      dVar17 * 0.006111111111111111 * dVar54 * dVar41 * dVar39 +
                      (dVar307 * dVar120 * dVar17 * dVar39) / 540.0;
        }
        dVar386 = dVar386 * dVar328;
        dVar338 = dVar338 * dVar80;
        if (dVar16 < 0.32) {
          dVar194 = (double)(~uVar11 & (ulong)local_f78);
          dVar111 = dVar393 * dVar263;
          dVar194 = dVar233 * 1.1428571428571428 * dVar178 +
                    dVar263 * 1.1428571428571428 * dVar132 +
                    dVar194 * 1.1428571428571428 * dVar257 +
                    dVar19 * 1.1428571428571428 *
                    (dVar83 * dVar389 * dVar194 +
                    dVar328 * dVar233 * dVar119 * dVar263 +
                    dVar111 * dVar334 +
                    dVar36 * dVar233 * -480.0 * dVar385 +
                    dVar37 * dVar194 * dVar204 +
                    dVar263 * 1.7724538509055159 * 240.0 * dVar37 * dVar233 +
                    (dVar173 * dVar194 * 30720.0 +
                    dVar275 * dVar194 * -5760.0 +
                    dVar19 * dVar194 * 448.0 +
                    dVar233 * dVar263 * 448.0 +
                    dVar80 * dVar233 * -17280.0 * dVar263 + dVar258 * dVar233 * 153600.0 * dVar263)
                    * dVar198 +
                    dVar338 * 72.0 * dVar263 +
                    dVar350 * dVar194 +
                    dVar230 * 72.0 * dVar233 +
                    dVar233 * dVar263 * dVar259 +
                    dVar311 * dVar111 * 0.25 +
                    dVar35 * dVar194 * dVar329 * 0.5 +
                    dVar266 * dVar111 +
                    dVar335 * dVar393 * 0.5 +
                    (dVar174 * dVar194 * 26880.0 +
                    dVar258 * dVar194 * -2880.0 +
                    dVar80 * dVar194 * 768.0 +
                    dVar194 * -8.0 +
                    dVar173 * dVar233 * 161280.0 * dVar263 +
                    dVar275 * dVar233 * -11520.0 * dVar263 +
                    dVar19 * dVar233 * 1536.0 * dVar263 +
                    dVar126 * dVar194 + dVar197 * dVar233 * -8847360.0 * dVar263) * dVar35 +
                    dVar386 * dVar385 * 0.5);
        }
        else {
          dVar194 = (double)(uVar11 & (ulong)local_f78);
          auVar107._0_8_ = local_a08 * dVar194;
          auVar107._8_8_ = dStack_a00 * dVar194;
          auVar312 = divpd(auVar107,_DAT_00fc56a0);
          auVar108._0_8_ = local_da8 * dVar194;
          auVar108._8_8_ = dVar324 * dVar194;
          auVar55 = divpd(auVar108,_DAT_00fc5780);
          auVar109._0_8_ = dVar309 * dVar194;
          auVar109._8_8_ = dVar305 * dVar194;
          auVar89 = divpd(auVar109,_DAT_00fc59a0);
          auVar66._0_8_ = dVar367 * dVar194;
          auVar66._8_8_ = dStack_da0 * dVar194;
          auVar137 = divpd(auVar66,_DAT_00fc5900);
          dVar194 = (dVar194 * dVar278) / 9408.0 +
                    dVar306 * dVar194 +
                    ((dVar390 * dVar194 * -4.6972703222703225e-06 +
                      (((((((dVar279 * dVar194) / 5.3093446189056e+16 +
                           (dStack_d60 * dVar194) / -8.627661500560449e+25 +
                           (dVar392 * dVar194) / 1.1046592834779778e+24 +
                           (dVar399 * dVar194) / -1.493478751555308e+22 +
                           (dVar276 * dVar194) / 5.53739330121543e+31 +
                           (dVar383 * dVar194) / -6.123970353448437e+29 +
                           (local_d68 * dVar194) / 7.093855011571925e+27) - auVar312._8_8_) +
                          auVar312._0_8_ + auVar55._0_8_) - auVar55._8_8_) + auVar89._0_8_) -
                      auVar89._8_8_) + auVar137._0_8_) - auVar137._8_8_) +
                    (dVar199 * dVar51 * dVar203) / 21367357440.0 +
                    (local_628 * dVar51 * dVar203) / 16220160.0 +
                    dVar82 * dVar51 * 4.22754329004329e-05 * dVar203 +
                    dVar81 * dVar51 * 0.007653061224489796 * dVar203 +
                    (dStack_630 * dVar51 * dVar203) / 1.6551271225536316e+28 +
                    (dVar327 * dVar51 * dVar203) / 2.614442878957712e+24 +
                    (local_6a8 * dVar51 * dVar203) / 5.149926729501062e+20 +
                    (local_458 * dVar51 * dVar203) / 1.304074477633536e+17 +
                    (local_3e8 * dVar51 * dVar203) / 44244538490880.0 +
                    (dStack_3e0 * dVar51 * dVar203) / -925768876032.0 +
                    (dStack_450 * dVar51 * dVar203) / -2.308410703872e+15 +
                    (dStack_6a0 * dVar51 * dVar203) / -7.923804921239962e+18 +
                    (dVar364 * dVar51 * dVar203) / -3.5634170434773477e+22 +
                    (local_638 * dVar51 * dVar203) / -2.0268157175919785e+26 +
                    (dVar192 * dVar51 * dVar203) / -1.4198444362090846e+30 +
                    (dVar260 * dVar51 * dVar203) / -1344.0 +
                    (dStack_620 * dVar51 * dVar203) / -559104.0 +
                    (auVar97._0_8_ * dVar51 * dVar203) / -551485440.0;
        }
        dVar111 = dVar78 * dVar371 * 1.8171205928321397;
        if (dVar16 < 1.35) {
          dVar254 = (double)(~uVar9 & (ulong)local_f78);
          dVar254 = dVar370 * -2.6666666666666665 * dVar227 +
                    dVar122 * -2.6666666666666665 * dVar351 +
                    dVar254 * -2.6666666666666665 * dVar74 +
                    dVar71 * -2.6666666666666665 *
                    ((dVar254 * dVar24 * dVar27 +
                     dVar346 * dVar254 +
                     ((dVar195 * dVar122 * -4.0 * dVar370 +
                      dVar72 * dVar370 * dVar27 * dVar122 * 0.25 +
                      dVar69 * dVar370 * -2.0 * dVar27 * dVar122 + dVar226 * dVar254 * dVar27 * 0.5)
                     - dVar122 * dVar26 * dVar27 * dVar370)) * dVar73 +
                    (dVar122 + dVar122) * dVar280 +
                    (dVar370 + dVar370) * dVar176 +
                    (dVar254 + dVar254) * dVar115 +
                    dVar177 * dVar254 +
                    (dVar370 * dVar122 * dVar114 - dVar122 * dVar310 * dVar27 * dVar370 * 0.5));
        }
        else {
          dVar254 = (double)(uVar9 & (ulong)local_f78);
          auVar215._0_8_ = dVar302 * local_878 * dVar42;
          auVar215._8_8_ = dVar381 * dVar254;
          auVar137 = divpd(auVar215,_DAT_00f63130);
          auVar247._0_8_ = dVar365 * dVar254;
          auVar247._8_8_ = local_1c8 * local_878 * dVar42;
          auVar55 = divpd(auVar247,_DAT_00f63140);
          auVar299._0_8_ = dStack_1c0 * local_878 * dVar42;
          auVar299._8_8_ = dVar382 * dVar254;
          auVar267 = divpd(auVar299,_DAT_00f63150);
          auVar248._0_8_ = dVar366 * dVar254;
          auVar248._8_8_ = dVar224 * local_878 * dVar42;
          auVar89 = divpd(auVar248,_DAT_00f63160);
          auVar249._0_8_ = dVar273 * local_878 * dVar42;
          auVar249._8_8_ = dVar362 * dVar254;
          auVar138 = divpd(auVar249,_DAT_00f63170);
          auVar216._0_8_ = dVar348 * dVar254;
          auVar216._8_8_ = dVar325 * local_878 * dVar42;
          auVar312 = divpd(auVar216,_DAT_00f63180);
          dVar254 = ((((((((((dVar254 * dVar43) / 240.0 +
                             (dVar255 * local_878 * dVar42) / -48.0 +
                             (dVar160 * dVar254) / -18.0 + (dVar25 * local_878 * dVar42) / 6.0 +
                            auVar137._0_8_) - auVar137._8_8_) - auVar55._8_8_) + auVar55._0_8_ +
                         auVar267._0_8_) - auVar267._8_8_) - auVar89._8_8_) + auVar89._0_8_ +
                      auVar138._0_8_) - auVar138._8_8_) - auVar312._8_8_) + auVar312._0_8_;
        }
        dVar282 = dVar282 * dVar13;
        dVar228 = dVar228 * dVar265;
        if (dVar16 < 0.27) {
          local_f78 = (double)(~uVar10 & (ulong)local_f78);
          dVar33 = dVar75 * dVar337 * 768.0 * dVar208;
          dVar208 = dVar75 * 24.0 *
                    (dVar123 * local_f78 +
                    dVar88 * dVar208 * -5.0 * dVar281 +
                    local_f78 * 10.0 * 1.7724538509055159 * dVar30 +
                    dVar13 * local_f78 * -72.0 +
                    dVar337 * dVar208 * -72.0 +
                    dVar229 * local_f78 * dVar29 * 0.5 +
                    dVar117 * dVar208 * dVar281 +
                    dVar261 * dVar281 * 0.5 +
                    (((dVar337 * dVar208 * 40.0 + dVar13 * local_f78 * 40.0) - dVar33) -
                    dVar202 * local_f78) * dVar29 + dVar391 * dVar228 * 0.5 +
                    dVar387 * dVar208 * dVar281 * 0.25 + dVar33 + dVar202 * local_f78) +
                    dVar282 * 48.0 * dVar208 +
                    dVar349 * 48.0 * local_f78 +
                    dVar262 * 48.0 * dVar337 + dVar326 * dVar208 * 48.0 * dVar337;
        }
        else {
          auVar300._0_8_ = local_6b8 * dVar205 * dVar44;
          auVar300._8_8_ = dStack_6b0 * dVar205 * dVar44;
          auVar312 = divpd(auVar300,_DAT_00fc57a0);
          auVar217._0_8_ = dVar205 * dVar31 * dVar44;
          auVar217._8_8_ = dVar205 * dVar303 * dVar44;
          auVar137 = divpd(auVar217,_DAT_00fc5840);
          local_f78 = (double)((ulong)local_f78 & uVar10);
          auVar317._0_8_ = local_bb8 * local_f78;
          auVar317._8_8_ = dStack_6f0 * local_f78;
          auVar89 = divpd(auVar317,_DAT_00fc5ac0);
          auVar398._0_8_ = dVar256 * local_f78;
          auVar398._8_8_ = dStack_bb0 * local_f78;
          auVar92 = divpd(auVar398,_DAT_00fc5bb0);
          auVar318._0_8_ = local_9e8 * local_f78;
          auVar318._8_8_ = dStack_9e0 * local_f78;
          auVar138 = divpd(auVar318,_DAT_00fc57d0);
          auVar345._0_8_ = dStack_750 * local_f78;
          auVar345._8_8_ = local_768 * local_f78;
          auVar267 = divpd(auVar345,_DAT_00fc5b20);
          auVar358._0_8_ = local_738 * local_f78;
          auVar358._8_8_ = dStack_730 * local_f78;
          auVar209 = divpd(auVar358,_DAT_00fc5bd0);
          auVar359._0_8_ = local_748 * local_f78;
          auVar359._8_8_ = dVar347 * local_f78;
          auVar373 = divpd(auVar359,_DAT_00fc63f0);
          auVar360._0_8_ = dVar277 * local_f78;
          auVar360._8_8_ = dVar304 * local_f78;
          auVar90 = divpd(auVar360,_DAT_00fc5d90);
          auVar301._0_8_ = local_f78 * local_788;
          auVar301._8_8_ = local_f78 * dStack_780;
          auVar55 = divpd(auVar301,_DAT_00fc5b30);
          dVar208 = ((((((((auVar267._8_8_ + (dStack_760 * local_f78) / -8.934630842486435e+31 +
                           auVar267._0_8_) - auVar209._8_8_) + auVar209._0_8_) - auVar373._8_8_) +
                       auVar373._0_8_) - auVar90._8_8_) + auVar90._0_8_ + auVar55._0_8_) -
                    auVar55._8_8_) +
                    dVar308 * local_f78 +
                    (((local_6f8 * local_f78) / 745472.0 +
                     dVar45 * local_f78 * -3.0438311688311688e-05 +
                     (((((dStack_740 * local_f78) / -1.24654178009088e+17 +
                        (local_758 * local_f78) / 2.308410703872e+15) - auVar89._8_8_) +
                      auVar89._0_8_) - auVar92._8_8_) + auVar92._0_8_) - auVar138._8_8_) +
                    auVar138._0_8_ +
                    dVar116 * dVar205 * 4.588885732696935e-31 * dVar44 +
                    (dVar333 * dVar205 * dVar44) / -2.638135332978604e+28 +
                    local_478 * dVar205 * 2.9767152251494278e-27 * dVar44 +
                    ((dVar323 * dVar205 * -1.0330674055506187e-21 * dVar44 +
                      dVar380 * dVar205 * 6.419508807886076e-20 * dVar44 +
                      ((local_4c8 * dVar205 * -9.963564958965524e-15 * dVar44 +
                        (dStack_4c0 * dVar205 * dVar44) / 2207210536960.0 + auVar312._0_8_) -
                      auVar312._8_8_) + auVar137._0_8_) - auVar137._8_8_) +
                    dVar77 * dVar205 * -1.8676367771303596e-11 * dVar44 +
                    dVar363 * dVar205 * 6.895252899056353e-10 * dVar44 +
                    ((double)local_b98._8_8_ * dVar205 * dVar44) / -44564480.0 +
                    dStack_470 * dVar205 * 6.297278025793651e-07 * dVar44 +
                    dVar384 * dVar205 * -1.475575206043956e-05 * dVar44 +
                    dVar76 * dVar205 * 0.0002739448051948052 * dVar44 +
                    dVar118 * dVar205 * -0.0036458333333333334 * dVar44 +
                    dVar274 * dVar205 * 0.026785714285714284 * dVar44 +
                    dVar158 * dVar205 * -6.156813072833613e-37 * dVar44 +
                    local_468 * dVar205 * -5.2947108149957596e-33 * dVar44 +
                    (dStack_460 * dVar205 * dVar44) / 1.7135877778106135e+34;
        }
        dVar127 = dVar127 * dVar283 * 1.8171205928321397;
        dVar33 = 0.0;
        if (dVar1 < dVar159) {
          auVar110._0_8_ = dVar46 * local_4e8 * dVar41;
          auVar110._8_8_ = local_ba8 * dVar46 * dVar130;
          auVar137 = divpd(auVar110,_DAT_00fc6400);
          dVar33 = (dVar41 * dVar130 * dVar166 +
                    ((((dVar124 * dVar371 * 0.43209876543209874 * dVar28 +
                       dVar208 * dVar78 * 0.43209876543209874 * dVar28 +
                       dVar225 * -0.07021228148148148 * dVar79 * dVar53 +
                       dVar40 * dVar196 * 1.5874010519681996 * -0.0487364524005487 * dVar28 +
                       dVar254 * dVar32 +
                       dVar128 * dVar339 +
                       dVar368 * dVar125 * dVar14 +
                       dVar207 * -0.1728395061728395 * dVar206 +
                       dVar352 * -0.1728395061728395 * dVar206) - (dVar14 * dVar48) / 5.0) -
                     auVar137._0_8_) - auVar137._8_8_) +
                   local_a58 * 1.5874010519681996 * dVar22 * 0.018276169650205763 * dVar28 +
                   dVar111 * -0.1728395061728395 * dVar330 +
                   dVar127 * -0.010531842222222223 * dVar264 +
                   dVar369 * -0.010531842222222223 * dVar234 +
                   dVar232 * dVar14 * dVar47 * dVar49 +
                   dVar194 * 1.8171205928321397 * dVar20 * 0.026329605555555555 * dVar112 +
                   dVar41 * dVar130 * dVar165 * dVar136 +
                   dVar225 * -0.010531842222222223 * dVar264 +
                   dVar130 * dVar340 * dVar41 * dVar49 * dVar135 +
                   dVar121 * dVar394 * -0.07021228148148148 +
                   dVar163 * -0.007310467860082304 * dVar161 * dVar172 +
                   dVar231 * 0.028084912592592593 * dVar53 * dVar133) * dVar175 +
                   dVar15 * -0.9847450218426964 * dVar84 * 0.125;
        }
        pdVar3 = out->v2rhosigma;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar6 = (long)(p->dim).v2rhosigma * sVar7;
          pdVar3[lVar6] = dVar33 * dVar50 + dVar85 + dVar85 + pdVar3[lVar6];
        }
        pdVar3 = out->v2rholapl;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x8004U) == 0)) {
          lVar6 = (long)(p->dim).v2rholapl * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        }
        dVar15 = 0.0;
        if (dVar1 < dVar159) {
          dVar15 = dVar86 * -0.006440861637851617 * dVar330 * 2.884499140614817 +
                   (dVar18 / dVar223) * dVar196 * dVar52 * -0.02146953879283872 * dVar235 +
                   local_a58 * dVar307 * dVar52 * 0.01610215409462904 * dVar235;
        }
        pdVar3 = out->v2rhotau;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10004U) == 0)) {
          lVar6 = (long)(p->dim).v2rhotau * sVar7;
          pdVar3[lVar6] = dVar15 * dVar50 + dVar134 + dVar134 + pdVar3[lVar6];
        }
        dVar15 = dVar130 * dVar130;
        dVar18 = 0.0;
        if (1e-10 <= dVar70) {
          dVar18 = (dVar21 / (dVar12 * dVar23)) * dVar17 * -5.977664547169544e-05 *
                   dVar193 * 1.2599210498948732 * dVar120 * dVar113 +
                   dVar54 * dVar17 * 0.006111111111111111 * dVar113 * dVar15;
        }
        if (dVar16 < 1.35) {
          dVar17 = (double)(~uVar9 & (ulong)dVar18);
          dVar12 = dVar370 * dVar370;
          local_cc8 = dVar71 * -2.6666666666666665 *
                      (dVar73 * (dVar24 * dVar17 * dVar27 +
                                dVar346 * dVar17 +
                                ((dVar12 * -4.0 * dVar195 +
                                 dVar72 * dVar12 * dVar27 * 0.25 +
                                 dVar69 * -2.0 * dVar12 * dVar27 + dVar226 * dVar17 * dVar27 * 0.5)
                                - dVar26 * dVar12 * dVar27)) +
                      dVar370 * 4.0 * dVar280 +
                      (dVar17 + dVar17) * dVar115 +
                      dVar177 * dVar17 + (dVar114 * dVar12 - dVar310 * dVar12 * dVar27 * 0.5)) +
                      dVar17 * -2.6666666666666665 * dVar74 + dVar370 * -5.333333333333333 * dVar351
          ;
        }
        else {
          local_878 = local_878 * local_878;
          dVar12 = (double)(uVar9 & (ulong)dVar18);
          auVar379._0_8_ = dVar302 * local_878;
          auVar379._8_8_ = dVar381 * dVar12;
          auVar267 = divpd(auVar379,_DAT_00f63130);
          auVar319._0_8_ = dVar365 * dVar12;
          auVar319._8_8_ = local_1c8 * local_878;
          auVar89 = divpd(auVar319,_DAT_00f63140);
          auVar154._0_8_ = dStack_1c0 * local_878;
          auVar154._8_8_ = dVar382 * dVar12;
          auVar137 = divpd(auVar154,_DAT_00f63150);
          auVar320._0_8_ = dVar366 * dVar12;
          auVar320._8_8_ = dVar224 * local_878;
          auVar138 = divpd(auVar320,_DAT_00f63160);
          auVar155._0_8_ = dVar273 * local_878;
          auVar155._8_8_ = dVar362 * dVar12;
          auVar312 = divpd(auVar155,_DAT_00f63170);
          auVar186._0_8_ = dVar348 * dVar12;
          auVar186._8_8_ = dVar325 * local_878;
          auVar55 = divpd(auVar186,_DAT_00f63180);
          local_cc8 = ((((((((((dVar43 * dVar12) / 240.0 +
                               (dVar255 * local_878) / -48.0 +
                               (dVar160 * dVar12) / -18.0 + (dVar25 * local_878) / 6.0 +
                              auVar267._0_8_) - auVar267._8_8_) - auVar89._8_8_) + auVar89._0_8_ +
                           auVar137._0_8_) - auVar137._8_8_) - auVar138._8_8_) + auVar138._0_8_ +
                        auVar312._0_8_) - auVar312._8_8_) - auVar55._8_8_) + auVar55._0_8_;
        }
        if (dVar16 < 0.27) {
          dVar17 = (double)(~uVar10 & (ulong)dVar18);
          dVar12 = dVar337 * dVar337;
          dVar21 = dVar75 * 768.0 * dVar12;
          dVar12 = dVar349 * 48.0 * dVar17 +
                   dVar12 * 48.0 * dVar326 +
                   dVar282 * 96.0 * dVar337 +
                   dVar75 * 24.0 *
                   (dVar123 * dVar17 +
                   ((dVar17 * 10.0 * 1.7724538509055159 * dVar30 +
                    dVar13 * dVar17 * -72.0 +
                    dVar12 * -72.0 +
                    dVar229 * dVar17 * dVar29 * 0.5 +
                    dVar117 * dVar12 * dVar29 +
                    (((dVar12 * 40.0 + dVar13 * dVar17 * 40.0) - dVar21) - dVar202 * dVar17) *
                    dVar29 + dVar281 * dVar228 + dVar387 * dVar12 * dVar29 * 0.25 + dVar21 +
                    dVar202 * dVar17) - dVar88 * 5.0 * dVar12 * dVar29));
        }
        else {
          dVar12 = (double)(uVar10 & (ulong)dVar18);
          auVar67._0_8_ = local_bb8 * dVar12;
          auVar67._8_8_ = dStack_bb0 * dVar12;
          auVar137 = divpd(auVar67,_DAT_00fc57b0);
          auVar68._0_8_ = local_788 * dVar12;
          auVar68._8_8_ = dStack_780 * dVar12;
          auVar312 = divpd(auVar68,_DAT_00fc5b30);
          auVar218._0_8_ = local_9e8 * dVar12;
          auVar218._8_8_ = dStack_9e0 * dVar12;
          auVar55 = divpd(auVar218,_DAT_00fc57d0);
          auVar250._0_8_ = -dVar347 * dVar12;
          auVar250._8_8_ = dStack_760 * dVar12;
          auVar209 = divpd(auVar250,_DAT_00fc5d20);
          auVar251._0_8_ = local_758 * dVar12;
          auVar251._8_8_ = dStack_750 * dVar12;
          auVar373 = divpd(auVar251,_DAT_00fc6410);
          auVar252._0_8_ = local_748 * dVar12;
          auVar252._8_8_ = dStack_740 * dVar12;
          auVar90 = divpd(auVar252,_DAT_00fc5820);
          auVar253._0_8_ = dVar277 * dVar12;
          auVar253._8_8_ = dVar304 * dVar12;
          auVar92 = divpd(auVar253,_DAT_00fc5d90);
          auVar219._0_8_ = local_738 * dVar12;
          auVar219._8_8_ = dStack_730 * dVar12;
          auVar89 = divpd(auVar219,_DAT_00fc5bd0);
          dVar205 = dVar205 * dVar205;
          auVar220._0_8_ = local_6b8 * dVar205;
          auVar220._8_8_ = dStack_6b0 * dVar205;
          auVar138 = divpd(auVar220,_DAT_00fc57a0);
          auVar221._0_8_ = dVar31 * dVar205;
          auVar221._8_8_ = dVar303 * dVar205;
          auVar267 = divpd(auVar221,_DAT_00fc5840);
          dVar12 = dVar205 * dVar274 * 0.026785714285714284 +
                   dVar158 * dVar205 * -6.156813072833613e-37 +
                   (dStack_460 * dVar205) / 1.7135877778106135e+34 +
                   local_468 * dVar205 * -5.2947108149957596e-33 +
                   dVar116 * dVar205 * 4.588885732696935e-31 +
                   (dVar333 * dVar205) / -2.638135332978604e+28 +
                   local_478 * dVar205 * 2.9767152251494278e-27 +
                   ((dVar380 * dVar205 * 6.419508807886076e-20 +
                     dVar323 * dVar205 * -1.0330674055506187e-21 + auVar267._0_8_) - auVar267._8_8_)
                   + ((local_4c8 * dVar205 * -9.963564958965524e-15 +
                       (dStack_4c0 * dVar205) / 2207210536960.0 +
                       dVar77 * dVar205 * -1.8676367771303596e-11 +
                       dVar363 * dVar205 * 6.895252899056353e-10 +
                       ((double)local_b98._8_8_ * dVar205) / -44564480.0 +
                       dStack_470 * dVar205 * 6.297278025793651e-07 +
                       dVar384 * dVar205 * -1.475575206043956e-05 +
                       dVar118 * dVar205 * -0.0036458333333333334 +
                       dVar76 * dVar205 * 0.0002739448051948052 + auVar138._0_8_) - auVar138._8_8_)
                   + ((((((auVar373._8_8_ +
                           (((dVar12 * local_768) / 1.0288727798616555e+30 + auVar209._0_8_) -
                           auVar209._8_8_) + auVar373._0_8_) - auVar90._8_8_) + auVar90._0_8_) -
                       auVar92._8_8_) + auVar92._0_8_) - auVar89._8_8_) + auVar89._0_8_ +
                   dVar12 * dVar308 +
                   ((((((dStack_6f0 * dVar12) / -20643840.0 +
                        dVar45 * dVar12 * -3.0438311688311688e-05 + (local_6f8 * dVar12) / 745472.0
                       + auVar137._0_8_) - auVar137._8_8_) + auVar312._0_8_) - auVar312._8_8_) -
                   auVar55._8_8_) + auVar55._0_8_ + (dVar256 * dVar12) / 1920.0;
        }
        if (dVar16 < 0.32) {
          dVar18 = (double)(~uVar11 & (ulong)dVar18);
          dVar13 = dVar233 * dVar233;
          dVar16 = dVar13 * dVar35;
          dVar13 = dVar19 * 1.1428571428571428 *
                   (dVar389 * dVar83 * dVar18 +
                   dVar13 * dVar328 * dVar119 +
                   dVar334 * dVar16 +
                   ((dVar204 * dVar37 * dVar18 +
                    dVar13 * 425.3889242173238 * dVar37 +
                    dVar198 * (dVar173 * dVar18 * 30720.0 +
                              dVar258 * dVar13 * 153600.0 +
                              dVar275 * dVar18 * -5760.0 +
                              dVar80 * dVar13 * -17280.0 + dVar13 * 448.0 + dVar19 * dVar18 * 448.0)
                    + dVar350 * dVar18 +
                      dVar338 * 144.0 * dVar233 +
                      dVar259 * dVar13 +
                      dVar329 * dVar18 * dVar35 * 0.5 +
                      dVar266 * dVar16 +
                      (dVar174 * dVar18 * 26880.0 +
                      dVar173 * dVar13 * 161280.0 +
                      dVar258 * dVar18 * -2880.0 +
                      dVar275 * dVar13 * -11520.0 +
                      dVar80 * dVar18 * 768.0 +
                      dVar19 * dVar13 * 1536.0 +
                      dVar18 * -8.0 + (dVar126 * dVar18 - dVar197 * 8847360.0 * dVar13)) * dVar35 +
                      dVar393 * dVar386 + dVar311 * dVar16 * 0.25) -
                   dVar36 * 480.0 * dVar13 * dVar35)) +
                   dVar18 * 1.1428571428571428 * dVar257 + dVar233 * 2.2857142857142856 * dVar132;
        }
        else {
          dVar18 = (double)(uVar11 & (ulong)dVar18);
          auVar361._0_8_ = dVar367 * dVar18;
          auVar361._8_8_ = dVar383 * dVar18;
          auVar90 = divpd(auVar361,_DAT_00fc6420);
          auVar321._0_8_ = local_da8 * dVar18;
          auVar321._8_8_ = dStack_da0 * dVar18;
          auVar209 = divpd(auVar321,_DAT_00fc5fb0);
          auVar322._0_8_ = dVar309 * dVar18;
          auVar322._8_8_ = dVar324 * dVar18;
          auVar373 = divpd(auVar322,_DAT_00fc5680);
          auVar187._0_8_ = dVar279 * dVar18;
          auVar187._8_8_ = dVar305 * dVar18;
          auVar137 = divpd(auVar187,_DAT_00fc5690);
          dVar51 = dVar51 * dVar51;
          auVar188._0_8_ = local_628 * dVar51;
          auVar188._8_8_ = dStack_620 * dVar51;
          auVar312 = divpd(auVar188,_DAT_00fc5a80);
          auVar189._0_8_ = dVar199 * dVar51;
          auVar189._8_8_ = auVar97._0_8_ * dVar51;
          auVar55 = divpd(auVar189,_DAT_00fc5a50);
          auVar222._0_8_ = local_3e8 * dVar51;
          auVar222._8_8_ = dStack_3e0 * dVar51;
          auVar267 = divpd(auVar222,_DAT_00fc5a60);
          auVar190._0_8_ = local_458 * dVar51;
          auVar190._8_8_ = dStack_450 * dVar51;
          auVar89 = divpd(auVar190,_DAT_00fc5a70);
          auVar191._0_8_ = local_6a8 * dVar51;
          auVar191._8_8_ = dStack_6a0 * dVar51;
          auVar138 = divpd(auVar191,_DAT_00fc6340);
          dVar13 = ((((((((((dVar82 * dVar51 * 4.22754329004329e-05 +
                            (dVar260 * dVar51) / -1344.0 +
                            dVar81 * 0.007653061224489796 * dVar51 +
                            (dVar192 * dVar51) / -1.4198444362090846e+30 +
                            (dStack_630 * dVar51) / 1.6551271225536316e+28 +
                            (local_638 * dVar51) / -2.0268157175919785e+26 +
                            (dVar327 * dVar51) / 2.614442878957712e+24 +
                            (dVar364 * dVar51) / -3.5634170434773477e+22) - auVar312._8_8_) +
                          auVar312._0_8_) - auVar55._8_8_) + auVar55._0_8_) - auVar267._8_8_) +
                      auVar267._0_8_) - auVar89._8_8_) + auVar89._0_8_) - auVar138._8_8_) +
                   auVar138._0_8_ +
                   dVar390 * dVar18 * -4.6972703222703225e-06 +
                   (dVar278 * dVar18) / 9408.0 +
                   dVar306 * dVar18 +
                   (((((((((local_d68 * dVar18) / 7.093855011571925e+27 +
                          (dStack_d60 * dVar18) / -8.627661500560449e+25 +
                          (dVar392 * dVar18) / 1.1046592834779778e+24 +
                          (dVar399 * dVar18) / -1.493478751555308e+22 +
                          (local_a08 * dVar18) / 2.1394273287347896e+20 +
                          (dStack_a00 * dVar18) / -3.26018619408384e+18 +
                          (dVar276 * dVar18) / 5.53739330121543e+31) - auVar90._8_8_) +
                        auVar90._0_8_) - auVar209._8_8_) + auVar209._0_8_) - auVar373._8_8_) +
                    auVar373._0_8_) - auVar137._8_8_) + auVar137._0_8_;
        }
        dVar16 = 0.0;
        if (dVar1 < dVar159) {
          dVar16 = dVar175 * (dVar135 * dVar49 * dVar340 * dVar15 +
                              dVar225 * -0.021063684444444446 * dVar234 +
                              dVar127 * -0.021063684444444446 * dVar234 +
                              dVar394 * 0.05265921111111111 * dVar339 +
                              dVar20 * dVar13 * 1.8171205928321397 * 0.026329605555555555 * dVar112
                              + dVar136 * dVar165 * dVar15 +
                                dVar111 * -0.345679012345679 * dVar206 +
                                dVar22 * dVar371 * 1.5874010519681996 * 0.036552339300411525 *
                                dVar28 + dVar78 * dVar12 * 0.43209876543209874 * dVar28 +
                                         dVar166 * dVar15 +
                                         local_cc8 * dVar32 + dVar130 * dVar46 * local_4e8 * -0.4 +
                                         dVar48 * 3.3019272488946267 * -0.0021519592369810357 *
                                         dVar156 * 1.2599210498948732 * dVar157 +
                                dVar163 * -0.014620935720164608 * dVar172 * dVar133 +
                                dVar34 * -0.00011455098324263666 *
                                dVar47 * 1.2599210498948732 * dVar157 +
                             (1.0 / (dVar23 * dVar23)) * dVar47 *
                             local_ed8 * dVar200 * -1.3960151919265937e-05);
        }
        pdVar3 = out->v2sigma2;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar6 = (long)(p->dim).v2sigma2 * sVar7;
          pdVar3[lVar6] = dVar16 * dVar50 + pdVar3[lVar6];
        }
        pdVar3 = out->v2sigmalapl;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x8004U) == 0)) {
          lVar6 = (long)(p->dim).v2sigmalapl * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        }
        dVar12 = 0.0;
        if (dVar1 < dVar159) {
          dVar12 = dVar52 * dVar307 * dVar371 * 0.01610215409462904 * dVar235 +
                   dVar86 * -0.006440861637851617 * dVar206 * 2.884499140614817;
        }
        pdVar3 = out->v2sigmatau;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10004U) == 0)) {
          lVar6 = (long)(p->dim).v2sigmatau * sVar7;
          pdVar3[lVar6] = dVar50 * dVar12 + pdVar3[lVar6];
        }
        pdVar3 = out->v2lapl2;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x8004U) == 0)) {
          lVar6 = (long)(p->dim).v2lapl2 * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        }
        pdVar3 = out->v2lapltau;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x18004U) == 0)) {
          lVar6 = (long)(p->dim).v2lapltau * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        }
        pdVar3 = out->v2tau2;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10004U) == 0)) {
          lVar6 = (long)(p->dim).v2tau2 * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        }
      }
      sVar7 = sVar7 + 1;
    } while (np != sVar7);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}